

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiMessage.cpp
# Opt level: O0

void __thiscall smf::MidiMessage::MidiMessage(MidiMessage *this,int command,int p1,int p2)

{
  value_type vVar1;
  reference pvVar2;
  allocator<unsigned_char> local_1d;
  int local_1c;
  int local_18;
  int p2_local;
  int p1_local;
  int command_local;
  MidiMessage *this_local;
  
  local_1c = p2;
  local_18 = p1;
  p2_local = command;
  _p1_local = this;
  std::allocator<unsigned_char>::allocator(&local_1d);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,3,&local_1d);
  std::allocator<unsigned_char>::~allocator(&local_1d);
  vVar1 = (value_type)p2_local;
  pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,0);
  *pvVar2 = vVar1;
  vVar1 = (value_type)local_18;
  pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,1);
  *pvVar2 = vVar1;
  vVar1 = (value_type)local_1c;
  pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,2);
  *pvVar2 = vVar1;
  return;
}

Assistant:

MidiMessage::MidiMessage(int command, int p1, int p2) : vector<uchar>(3) {
	(*this)[0] = (uchar)command;
	(*this)[1] = (uchar)p1;
	(*this)[2] = (uchar)p2;
}